

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O3

void __thiscall
absl::lts_20240722::inlined_vector_internal::
Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
::InitFrom(Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
           *this,Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
                 *other)

{
  ulong uVar1;
  Payload *construct_first;
  size_type __n;
  ulong construct_size;
  IteratorValueAdapter<std::allocator<absl::lts_20240722::status_internal::Payload>,_const_absl::lts_20240722::status_internal::Payload_*>
  values;
  IteratorValueAdapter<std::allocator<absl::lts_20240722::status_internal::Payload>,_const_absl::lts_20240722::status_internal::Payload_*>
  local_28;
  
  uVar1 = (other->metadata_).
          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<std::allocator<absl::lts_20240722::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  if (1 < uVar1) {
    construct_size = uVar1 >> 1;
    if ((uVar1 & 1) == 0) {
      construct_first = (Payload *)&this->data_;
      local_28.it_ = (Payload *)&other->data_;
    }
    else {
      __n = 2;
      if (2 < construct_size) {
        __n = construct_size;
      }
      construct_first =
           __gnu_cxx::new_allocator<absl::lts_20240722::status_internal::Payload>::allocate
                     ((new_allocator<absl::lts_20240722::status_internal::Payload> *)this,__n,
                      (void *)0x0);
      (this->data_).allocated.allocated_data = construct_first;
      (this->data_).allocated.allocated_capacity = __n;
      local_28.it_ = (other->data_).allocated.allocated_data;
    }
    ConstructElements<std::allocator<absl::lts_20240722::status_internal::Payload>,absl::lts_20240722::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20240722::status_internal::Payload>,absl::lts_20240722::status_internal::Payload_const*>>
              ((type_identity_t<std::allocator<absl::lts_20240722::status_internal::Payload>_> *)
               this,construct_first,&local_28,construct_size);
    (this->metadata_).
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<std::allocator<absl::lts_20240722::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
    .super_Storage<unsigned_long,_1UL,_false>.value =
         (other->metadata_).
         super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<std::allocator<absl::lts_20240722::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
         .super_Storage<unsigned_long,_1UL,_false>.value;
    return;
  }
  __assert_fail("false && \"n > 0\"",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/container/internal/inlined_vector.h"
                ,0x246,
                "auto absl::inlined_vector_internal::Storage<absl::status_internal::Payload, 1, std::allocator<absl::status_internal::Payload>>::InitFrom(const Storage<Payload, 1, allocator<Payload>> &)::(anonymous class)::operator()() const [T = absl::status_internal::Payload, N = 1, A = std::allocator<absl::status_internal::Payload>]"
               );
}

Assistant:

SizeType<A> GetSize() const { return GetSizeAndIsAllocated() >> 1; }